

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall Math_InnerProduct_Test::TestBody(Math_InnerProduct_Test *this)

{
  int maxExp;
  int maxExp_00;
  int maxExp_01;
  int maxExp_02;
  int maxExp_03;
  int maxExp_04;
  int maxExp_05;
  int maxExp_06;
  int minExp;
  uint64_t uVar1;
  char *message;
  uint64_t sequenceIndex;
  Float terms;
  Float terms_2;
  Float terms_4;
  Float terms_6;
  Float terms_1;
  Float terms_3;
  Float terms_5;
  Float terms_7;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM8_Qb;
  Float dab;
  Float ab;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  
  for (sequenceIndex = 0; sequenceIndex != 100000; sequenceIndex = sequenceIndex + 1) {
    uVar1 = sequenceIndex;
    pbrt::RNG::SetSequence(&rng,sequenceIndex);
    minExp = (int)uVar1;
    r.rng = &rng;
    terms = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp);
    terms_2 = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp_00);
    terms_4 = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp_01);
    terms_6 = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp_02);
    terms_1 = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp_03);
    terms_3 = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp_04);
    terms_5 = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp_05);
    terms_7 = TestBody::anon_class_8_1_ba1d750b::operator()(&r,minExp,maxExp_06);
    ab = pbrt::InnerProduct<float,float,float,float,float,float,float,float>
                   (terms,terms_1,terms_2,terms_3,terms_4,terms_5,terms_6,terms_7);
    auVar2._0_8_ = (double)terms;
    auVar2._8_8_ = in_XMM8_Qb;
    auVar5._0_8_ = (double)terms_1;
    auVar5._8_8_ = in_XMM8_Qb;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (double)terms_2 * (double)terms_3;
    auVar2 = vfmadd231sd_fma(auVar7,auVar2,auVar5);
    auVar3._0_8_ = (double)terms_4;
    auVar3._8_8_ = in_XMM8_Qb;
    auVar6._0_8_ = (double)terms_5;
    auVar6._8_8_ = in_XMM8_Qb;
    auVar2 = vfmadd213sd_fma(auVar6,auVar3,auVar2);
    auVar4._0_8_ = (double)terms_6;
    auVar4._8_8_ = in_XMM8_Qb;
    auVar8._0_8_ = (double)terms_7;
    auVar8._8_8_ = in_XMM8_Qb;
    auVar2 = vfmadd213sd_fma(auVar8,auVar4,auVar2);
    dab = (Float)auVar2._0_8_;
    testing::internal::CmpHelperEQ<float,float>((internal *)&gtest_ar,"ab","dab",&ab,&dab);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                 ,0x3b4,message);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(Math, InnerProduct) {
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        auto r = [&rng](int minExp = -10, int maxExp = 10) {
            Float logu = Lerp(rng.Uniform<Float>(), minExp, maxExp);
            Float val = std::pow(10, logu);
            Float sign = rng.Uniform<Float>() < .5 ? -1. : 1.;
            return val * sign;
        };

        Float a[4] = {r(), r(), r(), r()};
        Float b[4] = {r(), r(), r(), r()};
        Float ab = (Float)InnerProduct(a[0], b[0], a[1], b[1], a[2], b[2], a[3], b[3]);
        Float dab = double(a[0]) * double(b[0]) + double(a[1]) * double(b[1]) +
                    double(a[2]) * double(b[2]) + double(a[3]) * double(b[3]);
        EXPECT_EQ(ab, dab);
    }
}